

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-properties.c
# Opt level: O1

void gain_specialty(void)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  _Bool _Var4;
  player_ability *ppVar5;
  wchar_t pick;
  char buf [120];
  wchar_t local_9c;
  char local_98 [128];
  
  _Var4 = gain_specialty_menu(&local_9c);
  if (_Var4) {
    ppVar5 = lookup_ability("player",local_9c,L'\0');
    flag_on_dbg(player->specialties,10,local_9c,"player->specialties","pick");
    strnfmt(local_98,0x78,"Gained the %s specialty.",ppVar5->name);
    history_add(player,local_98,L'\n');
    ppVar3 = player->upkeep;
    puVar1 = &ppVar3->update;
    *puVar1 = *puVar1 | 0x3f;
    pbVar2 = (byte *)((long)&ppVar3->redraw + 1);
    *pbVar2 = *pbVar2 | 8;
  }
  return;
}

Assistant:

void gain_specialty(void)
{
	int pick;

	/* Make one choice */
	if (gain_specialty_menu(&pick)) {
		char buf[120];
		struct player_ability *ability = lookup_ability("player", pick, 0);

		/* Add it to the specialties */
		pf_on(player->specialties, pick);

		/* Specialty taken */
		strnfmt(buf, sizeof(buf), "Gained the %s specialty.", ability->name);

		/* Write a note */
		history_add(player, buf, HIST_GAIN_SPECIALTY);

		/* Update some stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_MANA | PU_SPELLS |
								   PU_SPECIALTY | PU_TORCH);

		/* Redraw Study Status */
		player->upkeep->redraw |= (PR_STUDY);
	}
}